

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O3

void libssh2_agent_free(LIBSSH2_AGENT *agent)

{
  if ((agent->fd != -1) && (agent->ops != (agent_ops *)0x0)) {
    (*agent->ops->disconnect)(agent);
  }
  if (agent->identity_agent_path != (char *)0x0) {
    (*agent->session->free)(agent->identity_agent_path,&agent->session->abstract);
  }
  agent_free_identities(agent);
  (*agent->session->free)(agent,&agent->session->abstract);
  return;
}

Assistant:

LIBSSH2_API void
libssh2_agent_free(LIBSSH2_AGENT *agent)
{
    /* Allow connection freeing when the socket has lost its connection */
    if(agent->fd != LIBSSH2_INVALID_SOCKET) {
        libssh2_agent_disconnect(agent);
    }

    if(agent->identity_agent_path)
        LIBSSH2_FREE(agent->session, agent->identity_agent_path);

    agent_free_identities(agent);
    LIBSSH2_FREE(agent->session, agent);
}